

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad4d_avx2.c
# Opt level: O3

void aom_sad32x32x4d_avx2(uint8_t *src,int src_stride,uint8_t **ref,int ref_stride,uint32_t *res)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  int iVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  iVar7 = 0x20;
  lVar6 = 0;
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  auVar11 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar1 = *(undefined1 (*) [32])src;
    auVar3 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(*ref + lVar6));
    auVar3 = vpaddd_avx2(auVar11._0_32_,auVar3);
    auVar11 = ZEXT3264(auVar3);
    auVar4 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(ref[1] + lVar6));
    auVar5 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(ref[2] + lVar6));
    auVar4 = vpaddd_avx2(auVar10._0_32_,auVar4);
    auVar10 = ZEXT3264(auVar4);
    auVar5 = vpaddd_avx2(auVar9._0_32_,auVar5);
    auVar9 = ZEXT3264(auVar5);
    auVar1 = vpsadbw_avx2(auVar1,*(undefined1 (*) [32])(ref[3] + lVar6));
    auVar1 = vpaddd_avx2(auVar8._0_32_,auVar1);
    auVar8 = ZEXT3264(auVar1);
    src = *(undefined1 (*) [32])src + src_stride;
    lVar6 = lVar6 + ref_stride;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  auVar3 = vshufps_avx(auVar3,auVar4,0x88);
  auVar1 = vshufps_avx(auVar5,auVar1,0x88);
  auVar1 = vphaddd_avx2(auVar3,auVar1);
  auVar2 = vpaddd_avx(auVar1._16_16_,auVar1._0_16_);
  *(undefined1 (*) [16])res = auVar2;
  return;
}

Assistant:

static AOM_FORCE_INLINE void aom_sadMxNx4d_avx2(
    int M, int N, const uint8_t *src, int src_stride,
    const uint8_t *const ref[4], int ref_stride, uint32_t res[4]) {
  __m256i src_reg, ref0_reg, ref1_reg, ref2_reg, ref3_reg;
  __m256i sum_ref0, sum_ref1, sum_ref2, sum_ref3;
  int i, j;
  const uint8_t *ref0, *ref1, *ref2, *ref3;

  ref0 = ref[0];
  ref1 = ref[1];
  ref2 = ref[2];
  ref3 = ref[3];
  sum_ref0 = _mm256_setzero_si256();
  sum_ref2 = _mm256_setzero_si256();
  sum_ref1 = _mm256_setzero_si256();
  sum_ref3 = _mm256_setzero_si256();

  for (i = 0; i < N; i++) {
    for (j = 0; j < M; j += 32) {
      // load src and all refs
      src_reg = _mm256_loadu_si256((const __m256i *)(src + j));
      ref0_reg = _mm256_loadu_si256((const __m256i *)(ref0 + j));
      ref1_reg = _mm256_loadu_si256((const __m256i *)(ref1 + j));
      ref2_reg = _mm256_loadu_si256((const __m256i *)(ref2 + j));
      ref3_reg = _mm256_loadu_si256((const __m256i *)(ref3 + j));

      // sum of the absolute differences between every ref-i to src
      ref0_reg = _mm256_sad_epu8(ref0_reg, src_reg);
      ref1_reg = _mm256_sad_epu8(ref1_reg, src_reg);
      ref2_reg = _mm256_sad_epu8(ref2_reg, src_reg);
      ref3_reg = _mm256_sad_epu8(ref3_reg, src_reg);
      // sum every ref-i
      sum_ref0 = _mm256_add_epi32(sum_ref0, ref0_reg);
      sum_ref1 = _mm256_add_epi32(sum_ref1, ref1_reg);
      sum_ref2 = _mm256_add_epi32(sum_ref2, ref2_reg);
      sum_ref3 = _mm256_add_epi32(sum_ref3, ref3_reg);
    }
    src += src_stride;
    ref0 += ref_stride;
    ref1 += ref_stride;
    ref2 += ref_stride;
    ref3 += ref_stride;
  }

  aggregate_and_store_sum(res, &sum_ref0, &sum_ref1, &sum_ref2, &sum_ref3);
}